

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsystem.c
# Opt level: O0

int xglx_get_monitor_dpi(int adapter)

{
  _Bool _Var1;
  ALLEGRO_SYSTEM *pAVar2;
  double dVar3;
  int dpi_vert;
  int dpi_hori;
  int y2_mm;
  int x2_mm;
  ALLEGRO_SYSTEM_XGLX *s;
  ALLEGRO_MONITOR_INFO info;
  ALLEGRO_MONITOR_INFO *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  int local_4;
  
  pAVar2 = al_get_system_driver();
  _Var1 = _al_xglx_get_monitor_info
                    ((ALLEGRO_SYSTEM_XGLX *)
                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
  if (_Var1) {
    dVar3 = sqrt((double)((int)((double)(local_10 - local_18) /
                               ((double)*(int *)((pAVar2[1].vt)->rest +
                                                (long)*(int *)&(pAVar2[1].vt)->get_time * 0x80 +
                                                0x20) * 0.03937)) *
                         (int)((double)(local_c - local_14) /
                              ((double)*(int *)((pAVar2[1].vt)->rest +
                                               (long)*(int *)&(pAVar2[1].vt)->get_time * 0x80 + 0x24
                                               ) * 0.03937))));
    local_4 = (int)dVar3;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int xglx_get_monitor_dpi(int adapter)
{
   ALLEGRO_MONITOR_INFO info;
   ALLEGRO_SYSTEM_XGLX *s = (void *)al_get_system_driver();
   int x2_mm;
   int y2_mm;
   int dpi_hori;
   int dpi_vert;

   if(!_al_xglx_get_monitor_info(s, adapter, &info)) {
      return 0;
   }

   x2_mm = DisplayWidthMM(s->x11display, DefaultScreen(s->x11display));
   y2_mm = DisplayHeightMM(s->x11display, DefaultScreen(s->x11display));

   dpi_hori = (info.x2 - info.x1) / (_AL_INCHES_PER_MM * x2_mm);
   dpi_vert = (info.y2 - info.y1) / (_AL_INCHES_PER_MM * y2_mm);

   return sqrt(dpi_hori * dpi_vert);
}